

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O2

shared_ptr<mocker::ir::Reg> mocker::ir::getDest(shared_ptr<mocker::ir::IRInst> *inst)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<mocker::ir::Reg> sVar1;
  shared_ptr<mocker::ir::Definition> def;
  shared_ptr<mocker::ir::IRInst> local_20;
  
  std::dynamic_pointer_cast<mocker::ir::Definition,mocker::ir::IRInst>(&local_20);
  if (local_20.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    (inst->super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (element_type *)0x0;
    (inst->super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    std::__shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2> *)inst,
               (__shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2> *)
               &(local_20.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->type);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_20.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  sVar1.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)inst;
  return (shared_ptr<mocker::ir::Reg>)
         sVar1.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Reg> getDest(const std::shared_ptr<IRInst> &inst) {
  auto def = dyc<Definition>(inst);
  if (!def)
    return nullptr;
  return def->getDest();
}